

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O0

void __thiscall adios2::aggregator::MPIShmChain::DestroyShm(MPIShmChain *this)

{
  Comm *this_00;
  long in_RDI;
  Win *in_stack_ffffffffffffffa8;
  string local_28 [40];
  
  this_00 = (Comm *)(in_RDI + 0x20);
  std::__cxx11::string::string(local_28);
  helper::Comm::Win_free(this_00,in_stack_ffffffffffffffa8,(string *)0xd76a66);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void MPIShmChain::DestroyShm() { m_Comm.Win_free(m_Win); }